

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool range_loop(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t value_00;
  gravity_value_t sender;
  gravity_value_t sender_00;
  gravity_value_t value_01;
  gravity_value_t value_02;
  _Bool _Var1;
  gravity_fiber_t *pgVar2;
  nanotime_t nVar3;
  nanotime_t t2;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_20b0;
  char *local_20a8;
  gravity_int_t i_1;
  gravity_int_t n_1;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_2090;
  gravity_class_t *local_2088;
  gravity_int_t i;
  gravity_int_t n;
  nanotime_t t1;
  gravity_object_t *pgStack_2068;
  _Bool is_forward;
  gravity_range_t *range;
  gravity_value_t value;
  gravity_closure_t *closure;
  char local_2038 [8];
  char _buffer_1 [4096];
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if (nargs < 2) {
    snprintf(local_1028,0x1000,"Incorrect number of arguments.");
    pgVar2 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar2,local_1028);
    _buffer_1._4088_8_ = gravity_class_null;
    value_02.field_1.n = 0;
    value_02.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_02,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  else if (args[1].isa == gravity_class_closure) {
    value.field_1 = args[1].field_1;
    range = (gravity_range_t *)args->isa;
    pgStack_2068 = (args->field_1).p;
    t1._7_1_ = (long)pgStack_2068->objclass < (long)pgStack_2068->identifier;
    value.isa = pgStack_2068;
    n = nanotime();
    if ((t1._7_1_ & 1) == 0) {
      local_20a8 = pgStack_2068->identifier;
      for (i_1 = (gravity_int_t)pgStack_2068->objclass; (long)local_20a8 <= i_1; i_1 = i_1 + -1) {
        t2 = (nanotime_t)gravity_class_int;
        local_20b0.n = i_1;
        sender_00.field_1.p = value.isa;
        sender_00.isa = (gravity_class_t *)range;
        _Var1 = gravity_vm_runclosure
                          (vm,(gravity_closure_t *)value.field_1.p,sender_00,(gravity_value_t *)&t2,
                           1);
        if (!_Var1) {
          return false;
        }
      }
    }
    else {
      i = (gravity_int_t)pgStack_2068->identifier;
      for (local_2088 = pgStack_2068->objclass; (long)local_2088 <= i;
          local_2088 = (gravity_class_t *)((long)&local_2088->isa + 1)) {
        n_1 = (gravity_int_t)gravity_class_int;
        local_2090.n = (gravity_int_t)local_2088;
        sender.field_1.p = value.isa;
        sender.isa = (gravity_class_t *)range;
        _Var1 = gravity_vm_runclosure
                          (vm,(gravity_closure_t *)value.field_1.p,sender,(gravity_value_t *)&n_1,1)
        ;
        if (!_Var1) {
          return false;
        }
      }
    }
    nVar3 = nanotime();
    value_00.field_1.p = (gravity_object_t *)(nVar3 - n);
    value_00.isa = gravity_class_int;
    gravity_vm_setslot(vm,value_00,_buffer._4088_4_);
    vm_local._7_1_ = true;
  }
  else {
    snprintf(local_2038,0x1000,"Argument must be a Closure.");
    pgVar2 = gravity_vm_fiber(vm);
    gravity_fiber_seterror(pgVar2,local_2038);
    value_01.field_1.n = 0;
    value_01.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_01,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool range_loop (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    if (nargs < 2) RETURN_ERROR("Incorrect number of arguments.");
    if (!VALUE_ISA_CLOSURE(GET_VALUE(1))) RETURN_ERROR("Argument must be a Closure.");

    gravity_closure_t *closure = VALUE_AS_CLOSURE(GET_VALUE(1));    // closure to execute
    gravity_value_t value = GET_VALUE(0);                           // self parameter
    gravity_range_t *range = VALUE_AS_RANGE(value);
    bool is_forward = range->from < range->to;

    nanotime_t t1 = nanotime();
    if (is_forward) {
        register gravity_int_t n = range->to;
        register gravity_int_t i = range->from;
        while (i <= n) {
            if (!gravity_vm_runclosure(vm, closure, value, &VALUE_FROM_INT(i), 1)) return false;
            ++i;
        }
    } else {
        register gravity_int_t n = range->from;            // 5...1
        register gravity_int_t i = range->to;
        while (n >= i) {
            if (!gravity_vm_runclosure(vm, closure, value, &VALUE_FROM_INT(n), 1)) return false;
            --n;
        }
    }
    nanotime_t t2 = nanotime();
    RETURN_VALUE(VALUE_FROM_INT(t2-t1), rindex);
}